

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * Catch::ConsoleReporter::getDoubleDashes_abi_cxx11_(void)

{
  int iVar1;
  
  if (getDoubleDashes[abi:cxx11]()::doubleDashes_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getDoubleDashes[abi:cxx11]()::doubleDashes_abi_cxx11_);
    if (iVar1 != 0) {
      getDoubleDashes[abi:cxx11]()::doubleDashes_abi_cxx11_._M_dataplus._M_p =
           (pointer)&getDoubleDashes[abi:cxx11]()::doubleDashes_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct(0x171480,'O');
      __cxa_atexit(std::__cxx11::string::~string,
                   &getDoubleDashes[abi:cxx11]()::doubleDashes_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&getDoubleDashes[abi:cxx11]()::doubleDashes_abi_cxx11_);
    }
  }
  return &getDoubleDashes[abi:cxx11]()::doubleDashes_abi_cxx11_;
}

Assistant:

static std::string const& getDoubleDashes() {
            static const std::string doubleDashes( CATCH_CONFIG_CONSOLE_WIDTH-1, '=' );
            return doubleDashes;
        }